

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void P_SerializePlayers(FSerializer *arc,bool skipload)

{
  char *__s2;
  undefined1 auVar1 [16];
  ulong *puVar2;
  int iVar3;
  undefined8 *puVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  undefined8 *puVar8;
  long *plVar9;
  FPlayerStart *mthing;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  char **charptr;
  int i;
  player_t *ppVar13;
  ulong uVar14;
  int numPlayers;
  char *name;
  char *n;
  int local_304;
  player_t *local_300;
  void *local_2f8;
  char **local_2f0;
  ulong *local_2e8;
  int local_2dc;
  char *local_2d8;
  player_t local_2d0;
  
  lVar7 = 0;
  local_304 = 0;
  do {
    local_304 = local_304 + (uint)playeringame[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  if (arc->w == (FWriter *)0x0) {
    Serialize(arc,"numplayers",&local_2dc,(int32_t *)0x0);
    bVar5 = FSerializer::BeginArray(arc,"players");
    iVar3 = local_2dc;
    if (bVar5) {
      uVar11 = (ulong)local_2dc;
      if (uVar11 == 1) {
        local_2d8 = (char *)0x0;
        bVar5 = FSerializer::BeginObject(arc,(char *)0x0);
        if (bVar5) {
          FSerializer::StringPtr(arc,"playername",&local_2d8);
          ppVar13 = (player_t *)&players;
          lVar7 = 0;
          bVar5 = false;
          do {
            if (playeringame[lVar7] == true) {
              if (bVar5) {
                if (ppVar13->mo != (APlayerPawn *)0x0) {
                  (*(ppVar13->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                  ppVar13->mo = (APlayerPawn *)0x0;
                }
              }
              else {
                player_t::player_t(&local_2d0);
                player_t::Serialize(&local_2d0,arc);
                if (skipload) {
                  ppVar13->mo = local_2d0.mo;
                }
                else {
                  local_2d0.MinPitch.Degrees = ((local_2d0.mo)->super_AActor).Angles.Pitch.Degrees;
                  local_2d0.MaxPitch.Degrees = local_2d0.MinPitch.Degrees;
                  CopyPlayer(ppVar13,&local_2d0,local_2d8);
                }
                player_t::~player_t(&local_2d0);
                bVar5 = true;
              }
            }
            lVar7 = lVar7 + 1;
            ppVar13 = ppVar13 + 1;
          } while (lVar7 != 8);
          FSerializer::EndObject(arc);
        }
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar11;
        uVar14 = SUB168(auVar1 * ZEXT816(0x2a0),0) | 8;
        if (SUB168(auVar1 * ZEXT816(0x2a0),8) != 0) {
          uVar14 = 0xffffffffffffffff;
        }
        uVar10 = uVar11 * 8;
        if (local_2dc < 0) {
          uVar10 = 0xffffffffffffffff;
        }
        local_2f0 = (char **)operator_new__(uVar10);
        local_2e8 = (ulong *)operator_new__(uVar14);
        *local_2e8 = uVar11;
        ppVar13 = (player_t *)(local_2e8 + 1);
        local_300 = ppVar13;
        if (iVar3 != 0) {
          lVar7 = 0;
          do {
            player_t::player_t(ppVar13);
            lVar7 = lVar7 + -0x2a0;
            ppVar13 = ppVar13 + 1;
          } while (uVar11 * -0x2a0 - lVar7 != 0);
        }
        local_2f8 = operator_new__(uVar11);
        if (0 < iVar3) {
          uVar14 = 0;
          ppVar13 = local_300;
          charptr = local_2f0;
          do {
            *charptr = (char *)0x0;
            bVar5 = FSerializer::BeginObject(arc,(char *)0x0);
            if (bVar5) {
              FSerializer::StringPtr(arc,"playername",charptr);
              player_t::Serialize(ppVar13,arc);
              FSerializer::EndObject(arc);
            }
            *(undefined1 *)((long)local_2f8 + uVar14) = 0;
            uVar14 = uVar14 + 1;
            ppVar13 = ppVar13 + 1;
            charptr = charptr + 1;
          } while (uVar11 != uVar14);
        }
        lVar7 = 0;
        do {
          *(byte *)((long)&local_2d0.mo + lVar7) = (playeringame[lVar7] ^ 1U) * '\x02';
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        if (skipload) {
          lVar7 = 0;
          do {
            *(undefined8 *)((long)&players + lVar7) = *(undefined8 *)((long)&local_300->mo + lVar7);
            lVar7 = lVar7 + 0x2a0;
          } while (lVar7 != 0x1500);
        }
        else {
          if (0 < iVar3) {
            uVar14 = 0;
            do {
              uVar10 = 0;
              do {
                if (*(char *)((long)&local_2d0.mo + uVar10) == '\0') {
                  puVar4 = (undefined8 *)
                           ((ulong)(((&DAT_017e5e98)[uVar10 * 0xa8] - 1 & 0x1ea) * 0x18) +
                           (&DAT_017e5e88)[uVar10 * 0x54]);
                  do {
                    puVar8 = puVar4;
                    puVar4 = (undefined8 *)*puVar8;
                  } while (*(int *)(puVar8 + 1) != 0x1ea);
                  __s2 = local_2f0[uVar14];
                  iVar6 = strcasecmp(*(char **)(puVar8[2] + 0x28),__s2);
                  if (iVar6 == 0) {
                    Printf("Found player %d (%s) at %d\n",uVar14 & 0xffffffff,__s2,
                           uVar10 & 0xffffffff);
                    CopyPlayer((player_t *)(&players + uVar10 * 0x54),local_300 + uVar14,
                               local_2f0[uVar14]);
                    *(undefined1 *)((long)&local_2d0.mo + uVar10) = 1;
                    *(undefined1 *)((long)local_2f8 + uVar14) = 1;
                    break;
                  }
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != 8);
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar11);
            if (0 < iVar3) {
              uVar14 = 0;
              do {
                if (*(char *)((long)local_2f8 + uVar14) == '\0') {
                  ppVar13 = (player_t *)&players;
                  uVar10 = 0;
LAB_0043fe62:
                  if (*(char *)((long)&local_2d0.mo + uVar10) != '\0') goto code_r0x0043fe69;
                  puVar4 = (undefined8 *)
                           ((long)&((ppVar13->userinfo).
                                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                   .Nodes)->Next +
                           (ulong)(((ppVar13->userinfo).
                                    super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                    .Size - 1 & 0x1ea) * 0x18));
                  do {
                    puVar8 = puVar4;
                    puVar4 = (undefined8 *)*puVar8;
                  } while (*(int *)(puVar8 + 1) != 0x1ea);
                  Printf("Assigned player %d (%s) to %d (%s)\n",uVar14 & 0xffffffff,
                         local_2f0[uVar14],uVar10 & 0xffffffff,*(undefined8 *)(puVar8[2] + 0x28));
                  CopyPlayer(ppVar13,local_300 + uVar14,local_2f0[uVar14]);
                  *(undefined1 *)((long)&local_2d0.mo + uVar10) = 1;
                  *(undefined1 *)((long)local_2f8 + uVar14) = 1;
                }
LAB_0043feef:
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar11);
            }
          }
          ppVar13 = local_300;
          plVar9 = &players;
          lVar7 = 0;
          do {
            if ((*(char *)((long)&local_2d0.mo + lVar7) == '\0') && ((long *)*plVar9 != (long *)0x0)
               ) {
              (**(code **)(*(long *)*plVar9 + 0x20))();
              *plVar9 = 0;
            }
            lVar7 = lVar7 + 1;
            plVar9 = plVar9 + 0x54;
          } while (lVar7 != 8);
          if (0 < iVar3) {
            uVar14 = 0;
            do {
              if (*(char *)((long)local_2f8 + uVar14) == '\0') {
                (*(ppVar13->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
                ppVar13->mo = (APlayerPawn *)0x0;
              }
              uVar14 = uVar14 + 1;
              ppVar13 = ppVar13 + 1;
            } while (uVar11 != uVar14);
          }
        }
        operator_delete__(local_2f8);
        puVar2 = local_2e8;
        lVar7 = *local_2e8 * 0x2a0;
        uVar11 = lVar7 + 8;
        uVar14 = *local_2e8;
        while (uVar14 != 0) {
          player_t::~player_t((player_t *)((long)puVar2 + lVar7 + -0x298));
          lVar7 = lVar7 + -0x2a0;
          uVar14 = lVar7;
        }
        operator_delete__(local_2e8,uVar11);
        operator_delete__(local_2f0);
      }
      FSerializer::EndArray(arc);
    }
    if (((!skipload) && (local_2dc < local_304)) && (deathmatch.Value == 0)) {
      puVar12 = &DAT_017e5e58;
      mthing = playerstarts;
      lVar7 = 0;
      do {
        if ((playeringame[lVar7] == true) && (*(long *)(puVar12 + -8) == 0)) {
          *puVar12 = 3;
          P_SpawnPlayer(mthing,(int)lVar7,level.flags2 >> 6 & 2);
        }
        lVar7 = lVar7 + 1;
        mthing = mthing + 1;
        puVar12 = puVar12 + 0x2a0;
      } while (lVar7 != 8);
    }
    player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  }
  else {
    Serialize(arc,"numplayers",&local_304,(int32_t *)0x0);
    bVar5 = FSerializer::BeginArray(arc,"players");
    if (bVar5) {
      lVar7 = 0;
      do {
        if ((playeringame[lVar7] == true) &&
           (bVar5 = FSerializer::BeginObject(arc,(char *)0x0), bVar5)) {
          puVar4 = (undefined8 *)
                   ((ulong)(((&DAT_017e5e98)[lVar7 * 0xa8] - 1 & 0x1ea) * 0x18) +
                   (&DAT_017e5e88)[lVar7 * 0x54]);
          do {
            puVar8 = puVar4;
            puVar4 = (undefined8 *)*puVar8;
          } while (*(int *)(puVar8 + 1) != 0x1ea);
          local_2d0.mo = *(APlayerPawn **)(puVar8[2] + 0x28);
          FSerializer::StringPtr(arc,"playername",(char **)&local_2d0);
          player_t::Serialize((player_t *)(&players + lVar7 * 0x54),arc);
          FSerializer::EndObject(arc);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      FSerializer::EndArray(arc);
    }
  }
  return;
code_r0x0043fe69:
  uVar10 = uVar10 + 1;
  ppVar13 = ppVar13 + 1;
  if (uVar10 == 8) goto LAB_0043feef;
  goto LAB_0043fe62;
}

Assistant:

void P_SerializePlayers(FSerializer &arc, bool skipload)
{
	int numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.isWriting())
	{
		// Record the number of players in this save.
		arc("numplayers", numPlayersNow);
		if (arc.BeginArray("players"))
		{
			// Record each player's name, followed by their data.
			for (i = 0; i < MAXPLAYERS; ++i)
			{
				if (playeringame[i])
				{
					if (arc.BeginObject(nullptr))
					{
						const char *n = players[i].userinfo.GetName();
						arc.StringPtr("playername", n);
						players[i].Serialize(arc);
						arc.EndObject();
					}
				}
			}
			arc.EndArray();
		}
	}
	else
	{
		arc("numplayers", numPlayers);

		if (arc.BeginArray("players"))
		{
			// If there is only one player in the game, they go to the
			// first player present, no matter what their name.
			if (numPlayers == 1)
			{
				ReadOnePlayer(arc, skipload);
			}
			else
			{
				ReadMultiplePlayers(arc, numPlayers, numPlayersNow, skipload);
			}
			arc.EndArray();
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}